

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

void al_restore_state(ALLEGRO_STATE *state)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long *plVar5;
  size_t n;
  long lVar6;
  undefined8 *puVar7;
  
  plVar5 = (long *)__tls_get_addr(&PTR_001d9500);
  puVar7 = (undefined8 *)*plVar5;
  if (puVar7 == (undefined8 *)0x0) {
    *plVar5 = (long)(plVar5 + 1);
    initialize_tls_values((thread_local_state *)(plVar5 + 1));
    puVar7 = (undefined8 *)*plVar5;
    if (puVar7 == (undefined8 *)0x0) {
      return;
    }
  }
  uVar1 = *(uint *)(state->_tls + 0x2d0);
  if ((uVar1 & 1) != 0) {
    uVar2 = *(undefined8 *)(state->_tls + 8);
    *puVar7 = *(undefined8 *)state->_tls;
    puVar7[1] = uVar2;
    *(undefined4 *)(puVar7 + 2) = *(undefined4 *)(state->_tls + 0x10);
    memcpy(puVar7 + 4,state->_tls + 0x20,0xb0);
    n = strlen((char *)((long)puVar7 + 0x124));
    _al_sane_strncpy((char *)((long)puVar7 + 0x124),state->_tls + 0x124,n);
  }
  if ((uVar1 & 2) != 0) {
    puVar7[0x21] = *(undefined8 *)(state->_tls + 0x108);
  }
  if (((uVar1 & 4) != 0) &&
     ((ALLEGRO_DISPLAY *)puVar7[0x1a] != *(ALLEGRO_DISPLAY **)(state->_tls + 0xd0))) {
    _al_set_current_display_only(*(ALLEGRO_DISPLAY **)(state->_tls + 0xd0));
  }
  if (((uVar1 & 8) != 0) &&
     ((ALLEGRO_BITMAP *)puVar7[0x1b] != *(ALLEGRO_BITMAP **)(state->_tls + 0xd8))) {
    al_set_target_bitmap(*(ALLEGRO_BITMAP **)(state->_tls + 0xd8));
  }
  if ((uVar1 & 0x10) != 0) {
    puVar7[0x20] = *(undefined8 *)(state->_tls + 0x248);
    uVar2 = *(undefined8 *)(state->_tls + 0x228);
    uVar3 = *(undefined8 *)(state->_tls + 0x230);
    uVar4 = *(undefined8 *)(state->_tls + 0x240);
    puVar7[0x1e] = *(undefined8 *)(state->_tls + 0x238);
    puVar7[0x1f] = uVar4;
    puVar7[0x1c] = uVar2;
    puVar7[0x1d] = uVar3;
  }
  if ((uVar1 & 0x20) != 0) {
    uVar2 = *(undefined8 *)(state->_tls + 0x118);
    puVar7[0x22] = *(undefined8 *)(state->_tls + 0x110);
    puVar7[0x23] = uVar2;
  }
  if ((uVar1 & 0x40) != 0) {
    lVar6 = *plVar5;
    if (lVar6 == 0) {
      *plVar5 = (long)(plVar5 + 1);
      initialize_tls_values((thread_local_state *)(plVar5 + 1));
      lVar6 = *plVar5;
      if (lVar6 == 0) goto LAB_001609bd;
    }
    if (*(long *)(lVar6 + 0xd8) != 0) {
      al_use_transform((ALLEGRO_TRANSFORM *)(state->_tls + 0x250));
    }
  }
LAB_001609bd:
  if ((uVar1 >> 8 & 1) != 0) {
    lVar6 = *plVar5;
    if (lVar6 == 0) {
      *plVar5 = (long)(plVar5 + 1);
      initialize_tls_values((thread_local_state *)(plVar5 + 1));
      lVar6 = *plVar5;
      if (lVar6 == 0) {
        return;
      }
    }
    if (*(long *)(lVar6 + 0xd8) != 0) {
      al_use_projection_transform((ALLEGRO_TRANSFORM *)(state->_tls + 0x290));
      return;
    }
  }
  return;
}

Assistant:

void al_restore_state(ALLEGRO_STATE const *state)
{
   thread_local_state *tls;
   INTERNAL_STATE *stored;
   int flags;

   if ((tls = tls_get()) == NULL)
      return;

   stored = (void *)state;
   flags = stored->flags;

#define _RESTORE(x) (tls->x = stored->tls.x)

   if (flags & ALLEGRO_STATE_NEW_DISPLAY_PARAMETERS) {
      _RESTORE(new_display_flags);
      _RESTORE(new_display_refresh_rate);
      _RESTORE(new_display_adapter);
      _RESTORE(new_window_x);
      _RESTORE(new_window_y);
      _RESTORE(new_display_settings);
      _al_sane_strncpy(tls->new_window_title, stored->tls.new_window_title,
                       strlen(tls->new_window_title));
   }

   if (flags & ALLEGRO_STATE_NEW_BITMAP_PARAMETERS) {
      _RESTORE(new_bitmap_format);
      _RESTORE(new_bitmap_flags);
   }

   if (flags & ALLEGRO_STATE_DISPLAY) {
      if (tls->current_display != stored->tls.current_display) {
         _al_set_current_display_only(stored->tls.current_display);
         ASSERT(tls->current_display == stored->tls.current_display);
      }
   }

   if (flags & ALLEGRO_STATE_TARGET_BITMAP) {
      if (tls->target_bitmap != stored->tls.target_bitmap) {
         al_set_target_bitmap(stored->tls.target_bitmap);
         ASSERT(tls->target_bitmap == stored->tls.target_bitmap);
      }
   }

   if (flags & ALLEGRO_STATE_BLENDER) {
      tls->current_blender = stored->stored_blender;
   }

   if (flags & ALLEGRO_STATE_NEW_FILE_INTERFACE) {
      _RESTORE(new_file_interface);
      _RESTORE(fs_interface);
   }

   if (flags & ALLEGRO_STATE_TRANSFORM) {
      ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
      if (bitmap)
         al_use_transform(&stored->stored_transform);
   }

   if (flags & ALLEGRO_STATE_PROJECTION_TRANSFORM) {
      ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
      if (bitmap)
         al_use_projection_transform(&stored->stored_projection_transform);
   }

#undef _RESTORE
}